

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O1

void dropt_free_context(dropt_context *context)

{
  dropt_clear_error(context);
  if (context != (dropt_context *)0x0) {
    free(context->sortedByLong);
    context->sortedByLong = (option_proxy *)0x0;
    free(context->sortedByShort);
    context->sortedByShort = (option_proxy *)0x0;
  }
  free(context);
  return;
}

Assistant:

void
dropt_free_context(dropt_context* context)
{
    dropt_clear_error(context);
    free_lookup_tables(context);
    free(context);
}